

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_tri_uv_bounding_box2
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL *uv_min,REF_DBL *uv_max)

{
  REF_CELL ref_cell;
  REF_GEOM pRVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  REF_INT ncell;
  REF_INT sense;
  REF_INT cells [2];
  REF_DBL uv [2];
  REF_INT nodes [27];
  int local_dc;
  long local_d8;
  REF_GEOM local_d0;
  REF_INT local_c4;
  REF_INT local_c0 [2];
  REF_DBL local_b8 [2];
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  pRVar1 = ref_grid->geom;
  uVar3 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_dc,local_c0);
  iVar2 = local_dc;
  if (uVar3 == 0) {
    if ((long)local_dc != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e7,
             "ref_geom_tri_uv_bounding_box2","expected two tri for box2 nodes",2,(long)local_dc);
      uVar3 = 1;
    }
    if (iVar2 == 2) {
      lVar4 = 0;
      do {
        uv_min[lVar4] = 1e+200;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      lVar4 = 0;
      do {
        uv_max[lVar4] = -1e+200;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      if (local_dc < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        local_d0 = pRVar1;
        do {
          uVar3 = ref_cell_nodes(ref_cell,local_c0[lVar4],local_a8);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x5ed,"ref_geom_tri_uv_bounding_box2",(ulong)uVar3,"cell nodes");
            return uVar3;
          }
          local_d8 = lVar4;
          if (0 < ref_cell->node_per) {
            lVar4 = 0;
            do {
              uVar3 = ref_geom_cell_tuv(local_d0,local_a8[lVar4],local_a8,2,local_b8,&local_c4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x5f1,"ref_geom_tri_uv_bounding_box2",(ulong)uVar3,"cell uv");
                return uVar3;
              }
              lVar5 = 0;
              do {
                dVar6 = uv_min[lVar5];
                if (local_b8[lVar5] <= uv_min[lVar5]) {
                  dVar6 = local_b8[lVar5];
                }
                uv_min[lVar5] = dVar6;
                lVar5 = lVar5 + 1;
              } while (lVar5 == 1);
              lVar5 = 0;
              do {
                dVar6 = uv_max[lVar5];
                if (uv_max[lVar5] <= local_b8[lVar5]) {
                  dVar6 = local_b8[lVar5];
                }
                uv_max[lVar5] = dVar6;
                lVar5 = lVar5 + 1;
              } while (lVar5 == 1);
              lVar4 = lVar4 + 1;
            } while (lVar4 < ref_cell->node_per);
          }
          lVar4 = local_d8 + 1;
          uVar3 = 0;
        } while (lVar4 < local_dc);
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e6,
           "ref_geom_tri_uv_bounding_box2",(ulong)uVar3,"list");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box2(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_DBL *uv_min,
                                                 REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, cell_node, iuv;
  REF_DBL uv[2];
  REF_INT i, ncell, cells[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");

  for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = REF_DBL_MAX;
  for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = REF_DBL_MIN;
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}